

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_random.cpp
# Opt level: O3

void FRandom::StaticWriteRNGState(FILE *file)

{
  FRandom *pFVar1;
  FArchive *this;
  long lVar2;
  FPNGChunkArchive arc;
  FPNGChunkArchive FStack_318;
  
  FPNGChunkArchive::FPNGChunkArchive(&FStack_318,file,0x644e6172);
  FArchive::operator<<(&FStack_318.super_FArchive,&rngseed);
  for (pFVar1 = RNGList; pFVar1 != (FRandom *)0x0; pFVar1 = pFVar1->Next) {
    if (pFVar1->NameCRC != 0) {
      this = FArchive::operator<<(&FStack_318.super_FArchive,&pFVar1->NameCRC);
      FArchive::operator<<(this,(DWORD *)&pFVar1->idx);
      lVar2 = 0x18;
      do {
        FArchive::operator<<(&FStack_318.super_FArchive,(DWORD *)((long)&pFVar1->Name + lVar2));
        lVar2 = lVar2 + 4;
      } while (lVar2 != 0x68);
    }
  }
  FPNGChunkArchive::~FPNGChunkArchive(&FStack_318);
  return;
}

Assistant:

void FRandom::StaticWriteRNGState (FILE *file)
{
	FRandom *rng;
	FPNGChunkArchive arc (file, RAND_ID);

	arc << rngseed;

	for (rng = FRandom::RNGList; rng != NULL; rng = rng->Next)
	{
		// Only write those RNGs that have names
		if (rng->NameCRC != 0)
		{
			arc << rng->NameCRC << rng->idx;
			for (int i = 0; i < SFMT::N32; ++i)
			{
				arc << rng->sfmt.u[i];
			}
		}
	}
}